

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdPrint(FILE *pFile,Kit_DsdNtk_t *pNtk)

{
  fwrite("F = ",4,1,(FILE *)pFile);
  if ((pNtk->Root & 1) != 0) {
    fputc(0x21,(FILE *)pFile);
  }
  Kit_DsdPrint_rec(pFile,pNtk,(uint)(pNtk->Root >> 1));
  return;
}

Assistant:

void Kit_DsdPrint( FILE * pFile, Kit_DsdNtk_t * pNtk )
{
    fprintf( pFile, "F = " );
    if ( Abc_LitIsCompl(pNtk->Root) )
        fprintf( pFile, "!" );
    Kit_DsdPrint_rec( pFile, pNtk, Abc_Lit2Var(pNtk->Root) );
//    fprintf( pFile, "\n" );
}